

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
              (JavascriptArray *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  Type TVar1;
  JavascriptLibrary *pJVar2;
  JavascriptBoolean *pJVar3;
  JavascriptBoolean *pJVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  ulong uVar9;
  ulong uVar10;
  uint i;
  bool bVar11;
  Var local_40;
  Var element;
  
  local_40 = (Var)0x0;
  uVar9 = (ulong)search & 0xffff000000000000;
  bVar11 = ((ulong)search & 0x1ffff00000000) != 0x1000000000000;
  if (bVar11 && uVar9 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar6) goto LAB_00bb4a24;
    *puVar8 = 0;
  }
  if (search == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00bb4a24;
    *puVar8 = 0;
  }
  if (bVar11 && uVar9 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                 ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                 "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar11) goto LAB_00bb4a24;
    *puVar8 = 0;
  }
  if ((ulong)search >> 0x32 == 0 && uVar9 != 0x1000000000000) {
    this = UnsafeVarTo<Js::RecyclableObject>(search);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      element = (Var)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)element = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar11) goto LAB_00bb4a24;
      *(undefined4 *)element = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    element = (Var)CONCAT44(element._4_4_,TVar1);
    if ((int)TVar1 < 0x58) goto LAB_00bb48d9;
    BVar7 = RecyclableObject::IsExternal(this);
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                   "GetTypeId aValue has invalid TypeId");
      if (!bVar11) {
LAB_00bb4a24:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
  }
  element = (Var)CONCAT44(element._4_4_,3);
LAB_00bb48d9:
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar3 = (pJVar2->super_JavascriptLibraryBase).booleanFalse.ptr;
  if (fromIndex < toIndex) {
    pJVar4 = (pJVar2->super_JavascriptLibraryBase).booleanTrue.ptr;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      BVar7 = TryTemplatedGetItem<Js::JavascriptArray,unsigned_int>
                        ((RecyclableObject *)pArr,fromIndex,&local_40,scriptContext,false);
      if (BVar7 == 0) {
        if ((int)element == 0) {
          return pJVar4;
        }
      }
      else {
        if (uVar9 == 0x1000000000000) {
          uVar10 = (ulong)local_40 & 0xffff000000000000;
          if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 && uVar10 == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar11) goto LAB_00bb4a24;
            *puVar8 = 0;
          }
          if (uVar10 == 0x1000000000000) {
            if (local_40 == search) {
              return pJVar4;
            }
            goto LAB_00bb49ff;
          }
        }
        bVar11 = JavascriptConversion::SameValueCommon<true>(local_40,search);
        if (bVar11) {
          return pJVar4;
        }
      }
LAB_00bb49ff:
      fromIndex = fromIndex + 1;
    } while (toIndex != fromIndex);
  }
  return pJVar3;
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }